

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.cpp
# Opt level: O1

bool __thiscall MeCab::Connector::openText(Connector *this,char *filename)

{
  uint uVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  size_t sVar6;
  char *__s;
  ulong uVar7;
  ostream *poVar8;
  char *pcVar9;
  char **ppcVar10;
  whatlog *pwVar11;
  char *pcVar12;
  char *pcVar13;
  long lVar14;
  bool bVar15;
  char *column [2];
  ifstream ifs;
  die local_249;
  char *local_248 [3];
  long local_230 [4];
  uint auStack_210 [122];
  
  std::ifstream::ifstream(local_230,filename,_S_in);
  uVar1 = *(uint *)((long)auStack_210 + *(long *)(local_230[0] + -0x18));
  if ((uVar1 & 5) == 0) {
    __s = (char *)operator_new__(0x2000);
    std::ios::widen((char)local_230 + (char)*(undefined8 *)(local_230[0] + -0x18));
    std::istream::getline((char *)local_230,(long)__s,'\0');
    sVar6 = strlen(__s);
    pcVar9 = __s + sVar6;
    ppcVar10 = local_248;
    uVar7 = 0;
    pcVar12 = __s;
    do {
      pcVar3 = pcVar9;
      pcVar4 = pcVar12;
      if (1 < uVar7) break;
      for (; pcVar13 = pcVar9, pcVar4 != pcVar9; pcVar4 = pcVar4 + 1) {
        if (*pcVar4 != '\t') {
          lVar14 = 0;
          do {
            bVar15 = lVar14 == 1;
            pcVar13 = pcVar3;
            if (bVar15) goto LAB_0015a251;
            lVar2 = lVar14 + 1;
            lVar14 = lVar14 + 1;
          } while (*pcVar4 != "\t "[lVar2]);
        }
        bVar15 = false;
        pcVar13 = pcVar4;
LAB_0015a251:
        if (!bVar15) break;
        pcVar3 = pcVar13;
      }
      *pcVar13 = '\0';
      if (*pcVar12 != '\0') {
        *ppcVar10 = pcVar12;
        ppcVar10 = ppcVar10 + 1;
        uVar7 = uVar7 + 1;
      }
      pcVar12 = pcVar13 + 1;
    } while (pcVar13 != pcVar9);
    if (uVar7 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                 ,0x6f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x39);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"tokenize2(buf.get(), \"\\t \", column, 2) == 2",0x2b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"format error: ",0xe);
      sVar6 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,__s,sVar6);
      die::~die(&local_249);
    }
    iVar5 = atoi(local_248[0]);
    this->lsize_ = (unsigned_short)iVar5;
    iVar5 = atoi(local_248[1]);
    this->rsize_ = (unsigned_short)iVar5;
    operator_delete__(__s);
  }
  else {
    pwVar11 = &this->what_;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pwVar11,"no such file or directory: ",0x1b);
    if (filename == (char *)0x0) {
      std::ios::clear((int)pwVar11 + (int)*(undefined8 *)(*(long *)pwVar11 + -0x18));
    }
    else {
      sVar6 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar11,filename,sVar6);
    }
  }
  std::ifstream::~ifstream(local_230);
  return (uVar1 & 5) == 0;
}

Assistant:

bool Connector::openText(const char *filename) {
  std::ifstream ifs(WPATH(filename));
  if (!ifs) {
    WHAT << "no such file or directory: " << filename;
    return false;
  }
  char *column[2];
  scoped_fixed_array<char, BUF_SIZE> buf;
  ifs.getline(buf.get(), buf.size());
  CHECK_DIE(tokenize2(buf.get(), "\t ", column, 2) == 2)
      << "format error: " << buf.get();
  lsize_ = std::atoi(column[0]);
  rsize_ = std::atoi(column[1]);
  return true;
}